

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddModels::operator()
          (AddModels *this,iterator_t *str,iterator_t *end)

{
  MultiAgentDecisionProcessDiscrete *this_00;
  
  this_00 = (MultiAgentDecisionProcessDiscrete *)this->_m_po->_m_decPOMDPDiscrete;
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel(this_00);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel(this_00);
  (**(code **)(*(long *)&this_00->super_MultiAgentDecisionProcess + 0x178))(this_00);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                POMDPDiscrete* p = _m_po->GetPOMDPDiscrete();
                // add the transition model
                p->CreateNewTransitionModel();
                p->CreateNewObservationModel();
                p->CreateNewRewardModel();
                //if(DEBUG_POMDP_PARSE) _m_po->GetPOMDPDiscrete()->PrintInfo();
            }